

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl_parser_test.cpp
# Opt level: O2

void __thiscall read_binary_from_file<double>::test_method(read_binary_from_file<double> *this)

{
  pair<tyti::stl::basic_solid<double>,_bool> *__return_storage_ptr__;
  shared_count *psVar1;
  assertion_result local_1d8;
  value_expr<bool_&> local_1c0;
  char *local_1b8;
  undefined1 local_1b0 [16];
  lazy_ostream local_1a0;
  undefined1 *local_190;
  value_expr<bool_&> *local_188;
  pair<tyti::stl::basic_solid<double>,_bool> out;
  string test_data;
  const_string local_f0;
  const_string local_e0;
  const_string local_d0;
  const_string local_c0;
  const_string local_b0;
  const_string local_a0;
  const_string local_90;
  const_string local_80;
  const_string local_70;
  const_string local_60;
  const_string local_50;
  const_string local_40;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&test_data,
             "/workspace/llm4binary/github/license_c_cmakelists/TinyTinni[P]FileSTL/test/testdata/cube_binary.stl"
             ,(allocator<char> *)&out);
  __return_storage_ptr__ = &out;
  tyti::stl::read<double>(__return_storage_ptr__,&test_data);
  local_40.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/TinyTinni[P]FileSTL/test/stl_parser_test.cpp"
  ;
  local_40.m_end = "";
  local_50.m_begin = "";
  local_50.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)__return_storage_ptr__,&local_40,0x37,&local_50);
  local_1c0.m_value = &out.second;
  boost::test_tools::assertion::value_expr<bool_&>::evaluate(&local_1d8,&local_1c0,false);
  local_188 = (value_expr<bool_&> *)local_1b0;
  local_1b0._0_8_ = "out.second";
  local_1b0._8_8_ = "";
  local_1a0.m_empty = false;
  local_1a0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001aa980;
  local_190 = boost::unit_test::lazy_ostream::inst;
  local_60.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/TinyTinni[P]FileSTL/test/stl_parser_test.cpp"
  ;
  local_60.m_end = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_1d8,&local_1a0,&local_60,0x37,CHECK,CHECK_BUILT_ASSERTION,0);
  psVar1 = &local_1d8.m_message.pn;
  boost::detail::shared_count::~shared_count(psVar1);
  local_70.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/TinyTinni[P]FileSTL/test/stl_parser_test.cpp"
  ;
  local_70.m_end = "";
  local_80.m_begin = "";
  local_80.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)psVar1,&local_70,0x3a,&local_80);
  local_1b0._0_8_ =
       ((long)out.first.normals.
              super__Vector_base<tyti::stl::basic_vec3<double>,_std::allocator<tyti::stl::basic_vec3<double>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
       (long)out.first.normals.
             super__Vector_base<tyti::stl::basic_vec3<double>,_std::allocator<tyti::stl::basic_vec3<double>_>_>
             ._M_impl.super__Vector_impl_data._M_start) / 0x18;
  local_1b0._8_4_ = 0xc;
  boost::test_tools::assertion::
  binary_expr<boost::test_tools::assertion::value_expr<unsigned_long>,_int,_boost::test_tools::assertion::op::EQ<unsigned_long,_int,_void>_>
  ::evaluate(&local_1d8,
             (binary_expr<boost::test_tools::assertion::value_expr<unsigned_long>,_int,_boost::test_tools::assertion::op::EQ<unsigned_long,_int,_void>_>
              *)local_1b0,false);
  local_1c0.m_value = (bool *)0x171916;
  local_1b8 = "";
  local_1a0.m_empty = false;
  local_1a0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001aa980;
  local_190 = boost::unit_test::lazy_ostream::inst;
  local_90.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/TinyTinni[P]FileSTL/test/stl_parser_test.cpp"
  ;
  local_90.m_end = "";
  local_188 = &local_1c0;
  boost::test_tools::tt_detail::report_assertion
            (&local_1d8,&local_1a0,&local_90,0x3a,CHECK,CHECK_BUILT_ASSERTION,0);
  psVar1 = &local_1d8.m_message.pn;
  boost::detail::shared_count::~shared_count(psVar1);
  local_a0.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/TinyTinni[P]FileSTL/test/stl_parser_test.cpp"
  ;
  local_a0.m_end = "";
  local_b0.m_begin = "";
  local_b0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)psVar1,&local_a0,0x3b,&local_b0);
  local_1b0._0_8_ =
       ((long)out.first.vertices.
              super__Vector_base<tyti::stl::basic_vec3<double>,_std::allocator<tyti::stl::basic_vec3<double>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
       (long)out.first.vertices.
             super__Vector_base<tyti::stl::basic_vec3<double>,_std::allocator<tyti::stl::basic_vec3<double>_>_>
             ._M_impl.super__Vector_impl_data._M_start) / 0x18;
  local_1b0._8_4_ = 0x24;
  boost::test_tools::assertion::
  binary_expr<boost::test_tools::assertion::value_expr<unsigned_long>,_int,_boost::test_tools::assertion::op::EQ<unsigned_long,_int,_void>_>
  ::evaluate(&local_1d8,
             (binary_expr<boost::test_tools::assertion::value_expr<unsigned_long>,_int,_boost::test_tools::assertion::op::EQ<unsigned_long,_int,_void>_>
              *)local_1b0,false);
  local_1c0.m_value = (bool *)0x171b8f;
  local_1b8 = "";
  local_1a0.m_empty = false;
  local_1a0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001aa980;
  local_190 = boost::unit_test::lazy_ostream::inst;
  local_c0.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/TinyTinni[P]FileSTL/test/stl_parser_test.cpp"
  ;
  local_c0.m_end = "";
  local_188 = &local_1c0;
  boost::test_tools::tt_detail::report_assertion
            (&local_1d8,&local_1a0,&local_c0,0x3b,CHECK,CHECK_BUILT_ASSERTION,0);
  psVar1 = &local_1d8.m_message.pn;
  boost::detail::shared_count::~shared_count(psVar1);
  local_d0.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/TinyTinni[P]FileSTL/test/stl_parser_test.cpp"
  ;
  local_d0.m_end = "";
  local_e0.m_begin = "";
  local_e0.m_end = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            ((unit_test_log_t *)psVar1,&local_d0,0x3c,&local_e0);
  local_1b0._0_8_ =
       (long)out.first.attributes.
             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)out.first.attributes.
             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
             super__Vector_impl_data._M_start >> 1;
  local_1b0._8_4_ = 0xc;
  boost::test_tools::assertion::
  binary_expr<boost::test_tools::assertion::value_expr<unsigned_long>,_int,_boost::test_tools::assertion::op::EQ<unsigned_long,_int,_void>_>
  ::evaluate(&local_1d8,
             (binary_expr<boost::test_tools::assertion::value_expr<unsigned_long>,_int,_boost::test_tools::assertion::op::EQ<unsigned_long,_int,_void>_>
              *)local_1b0,false);
  local_1c0.m_value = (bool *)0x171bab;
  local_1b8 = "";
  local_1a0.m_empty = false;
  local_1a0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001aa980;
  local_190 = boost::unit_test::lazy_ostream::inst;
  local_f0.m_begin =
       "/workspace/llm4binary/github/license_c_cmakelists/TinyTinni[P]FileSTL/test/stl_parser_test.cpp"
  ;
  local_f0.m_end = "";
  local_188 = &local_1c0;
  boost::test_tools::tt_detail::report_assertion
            (&local_1d8,&local_1a0,&local_f0,0x3c,CHECK,CHECK_BUILT_ASSERTION,0);
  boost::detail::shared_count::~shared_count(&local_1d8.m_message.pn);
  tyti::stl::basic_solid<double>::~basic_solid(&out.first);
  std::__cxx11::string::~string((string *)&test_data);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE_TEMPLATE(read_binary_from_file, T, test_types)
{
    const std::string test_data{  SOURCE_DIR "/testdata/cube_binary.stl" };

    auto out = stl::read<T>(test_data);
    BOOST_TEST(out.second);
    stl::basic_solid<T>& s = out.first;

    BOOST_TEST(s.normals.size() == 12);
    BOOST_TEST(s.vertices.size() == 3 * 12);
    BOOST_TEST(s.attributes.size() == 12);
}